

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

string * __thiscall google::protobuf::Message::ShortDebugString_abi_cxx11_(Message *this)

{
  long lVar1;
  string *in_RDI;
  Printer printer;
  string *debug_string;
  Printer *in_stack_ffffffffffffff30;
  Printer *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffffb0;
  Message *in_stack_ffffffffffffffb8;
  Printer *in_stack_ffffffffffffffc0;
  
  std::__cxx11::string::string((string *)in_RDI);
  TextFormat::Printer::Printer(in_stack_ffffffffffffff50);
  TextFormat::Printer::SetSingleLineMode((Printer *)&stack0xffffffffffffff60,true);
  TextFormat::Printer::SetExpandAny((Printer *)&stack0xffffffffffffff60,true);
  TextFormat::Printer::PrintToString
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 != 0) {
    std::__cxx11::string::size();
    in_stack_ffffffffffffff30 = (Printer *)std::__cxx11::string::operator[]((ulong)in_RDI);
    if ((char)in_stack_ffffffffffffff30->initial_indent_level_ == ' ') {
      std::__cxx11::string::size();
      std::__cxx11::string::resize((ulong)in_RDI);
    }
  }
  TextFormat::Printer::~Printer(in_stack_ffffffffffffff30);
  return in_RDI;
}

Assistant:

std::string Message::ShortDebugString() const {
  std::string debug_string;

  TextFormat::Printer printer;
  printer.SetSingleLineMode(true);
  printer.SetExpandAny(true);

  printer.PrintToString(*this, &debug_string);
  // Single line mode currently might have an extra space at the end.
  if (debug_string.size() > 0 && debug_string[debug_string.size() - 1] == ' ') {
    debug_string.resize(debug_string.size() - 1);
  }

  return debug_string;
}